

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O0

void __thiscall QHttpThreadDelegate::startRequest(QHttpThreadDelegate *this)

{
  bool bVar1;
  byte bVar2;
  ProxyType PVar3;
  NetworkError NVar4;
  QNetworkAccessAuthenticationManager *this_00;
  QNetworkProxyPrivate *pQVar5;
  QNetworkAccessCache **ppQVar6;
  QNetworkProxy *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar7;
  bool isH2;
  ConnectionType connectionType;
  bool isLocalSocket;
  char16_t *str;
  char16_t *str_1;
  char16_t *str_2;
  QAuthenticator auth;
  QNetworkAuthenticationCredential credential;
  QString path_1;
  QString host;
  QString path;
  QString extraData;
  QList<QByteArray> protocols;
  QUrl urlCopy;
  uint in_stack_fffffffffffffbc8;
  ComponentFormattingOption in_stack_fffffffffffffbcc;
  QNetworkAuthenticationCredential *in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd8;
  NetworkError in_stack_fffffffffffffbdc;
  QHttpThreadDelegate *in_stack_fffffffffffffbe0;
  QNetworkAccessCache *in_stack_fffffffffffffbe8;
  QHttpNetworkConnection *in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffbf8;
  undefined4 uVar8;
  QString *in_stack_fffffffffffffc00;
  undefined1 isProxy;
  QAuthenticator *in_stack_fffffffffffffc08;
  quint16 connectionCount;
  QNetworkAccessCachedHttpConnection *in_stack_fffffffffffffc10;
  int fromChannel;
  undefined6 in_stack_fffffffffffffc18;
  undefined2 in_stack_fffffffffffffc1e;
  QAuthenticator *in_stack_fffffffffffffc20;
  bool local_3aa;
  QString *in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 uVar9;
  uint uVar10;
  Connection local_2f8;
  Connection local_2f0;
  Connection local_2e8;
  Connection local_2e0;
  Connection local_2d8;
  Connection local_2d0;
  Connection local_2c8;
  Connection local_2c0;
  Connection local_2b8;
  Connection local_2b0;
  Connection local_2a8;
  Connection local_2a0;
  Connection local_298;
  Connection local_290;
  Connection local_288;
  Connection local_280;
  Connection local_278;
  Connection local_270;
  QAuthenticator local_268;
  QUrl local_260;
  undefined1 local_258 [96];
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  QString local_1d8 [7];
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  QString local_118;
  QArrayDataPointer<char16_t> local_100 [2];
  QArrayDataPointer<char16_t> local_d0 [2];
  QArrayDataPointer<char16_t> local_a0 [2];
  QByteArray local_70;
  QByteArray local_58;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined1 local_28 [24];
  QUrl local_10;
  long local_8;
  
  uVar8 = (undefined4)((ulong)in_stack_fffffffffffffbf8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QThreadStorage<QNetworkAccessCache_*>::hasLocalData
                    ((QThreadStorage<QNetworkAccessCache_*> *)0x30d5a0);
  if (!bVar1) {
    in_stack_fffffffffffffc58 = (QString *)operator_new(0x30);
    memset(in_stack_fffffffffffffc58,0,0x30);
    QNetworkAccessCache::QNetworkAccessCache((QNetworkAccessCache *)in_stack_fffffffffffffbd0);
    QThreadStorage<QNetworkAccessCache_*>::setLocalData
              ((QThreadStorage<QNetworkAccessCache_*> *)0x30d5e6,
               (QNetworkAccessCache *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8))
    ;
  }
  local_10.d = (QUrlPrivate *)0xaaaaaaaaaaaaaaaa;
  QHttpNetworkRequest::url
            ((QHttpNetworkRequest *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  QUrl::scheme();
  QVar7 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                     (size_t)in_stack_fffffffffffffbd0);
  bVar2 = QString::startsWith((QLatin1String *)local_28,(CaseSensitivity)QVar7.m_size);
  QString::~QString((QString *)0x30d67a);
  bVar2 = bVar2 & 1;
  if (bVar2 == 0) {
    QUrl::port((int)&local_10);
    QUrl::setPort((int)&local_10);
  }
  bVar1 = QHttpNetworkRequest::isHTTP2Allowed((QHttpNetworkRequest *)0x30d6dc);
  uVar10 = (uint)bVar1;
  bVar1 = QHttpNetworkRequest::isHTTP2Direct((QHttpNetworkRequest *)0x30d703);
  if (bVar1) {
    uVar10 = 2;
  }
  if (((((ulong)in_RDI[2].d.d.ptr & 1) == 0) && (uVar10 == 1)) &&
     (bVar1 = QHttpNetworkRequest::isH2cAllowed((QHttpNetworkRequest *)0x30d73d), !bVar1)) {
    uVar10 = 0;
  }
  bVar1 = QHttpNetworkRequest::isHTTP2Allowed((QHttpNetworkRequest *)0x30d75d);
  local_3aa = true;
  if (!bVar1) {
    local_3aa = QHttpNetworkRequest::isHTTP2Direct((QHttpNetworkRequest *)0x30d77e);
  }
  uVar9 = CONCAT13(local_3aa,(int3)in_stack_fffffffffffffc68);
  if (local_3aa != false) {
    if (((ulong)in_RDI[2].d.d.ptr & 1) == 0) {
      if (bVar2 == 0) {
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_100,(Data *)0x0,L"h2",2);
        QString::QString(&in_stack_fffffffffffffbd0->domain,
                         (DataPointer *)
                         CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        QUrl::setScheme((QString *)&local_10);
        QString::~QString((QString *)0x30da76);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffbd0);
      }
      else {
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_d0,(Data *)0x0,L"unix+h2",7);
        QString::QString(&in_stack_fffffffffffffbd0->domain,
                         (DataPointer *)
                         CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        QUrl::setScheme((QString *)&local_10);
        QString::~QString((QString *)0x30d9e0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffbd0);
      }
    }
    else {
      bVar1 = QHttpNetworkRequest::isHTTP2Direct((QHttpNetworkRequest *)0x30d7c6);
      if (!bVar1) {
        local_40 = 0xaaaaaaaaaaaaaaaa;
        local_38 = 0xaaaaaaaaaaaaaaaa;
        local_30 = 0xaaaaaaaaaaaaaaaa;
        QList<QByteArray>::QList((QList<QByteArray> *)0x30d808);
        QByteArray::QByteArray(&local_58,"h2",-1);
        QList<QByteArray>::operator<<
                  ((QList<QByteArray> *)in_stack_fffffffffffffbd0,
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        QByteArray::QByteArray(&local_70,"http/1.1",-1);
        QList<QByteArray>::operator<<
                  ((QList<QByteArray> *)in_stack_fffffffffffffbd0,
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        QByteArray::~QByteArray((QByteArray *)0x30d87d);
        QByteArray::~QByteArray((QByteArray *)0x30d88a);
        QScopedPointer<QSslConfiguration,_QScopedPointerDeleter<QSslConfiguration>_>::operator->
                  ((QScopedPointer<QSslConfiguration,_QScopedPointerDeleter<QSslConfiguration>_> *)
                   (in_RDI + 3));
        QSslConfiguration::setAllowedNextProtocols
                  ((QSslConfiguration *)in_stack_fffffffffffffbd0,
                   (QList<QByteArray> *)
                   CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        QList<QByteArray>::~QList((QList<QByteArray> *)0x30d8b8);
      }
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_a0,(Data *)0x0,L"h2s",3);
      QString::QString(&in_stack_fffffffffffffbd0->domain,
                       (DataPointer *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8))
      ;
      QUrl::setScheme((QString *)&local_10);
      QString::~QString((QString *)0x30d93c);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffbd0);
    }
  }
  local_118.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_118.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_118.d.size = -0x5555555555555556;
  QHttpNetworkRequest::peerVerifyName
            ((QHttpNetworkRequest *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  if (bVar2 != 0) {
    local_130 = 0xaaaaaaaaaaaaaaaa;
    local_128 = 0xaaaaaaaaaaaaaaaa;
    local_120 = 0xaaaaaaaaaaaaaaaa;
    QHttpNetworkRequest::fullLocalServerName
              ((QHttpNetworkRequest *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8))
    ;
    bVar1 = QString::isEmpty((QString *)0x30db2a);
    if (!bVar1) {
      QString::operator=(&local_118,(QString *)&local_130);
    }
    QString::~QString((QString *)0x30db50);
  }
  PVar3 = QNetworkProxy::type((QNetworkProxy *)in_stack_fffffffffffffbd0);
  if (PVar3 == NoProxy) {
    PVar3 = QNetworkProxy::type((QNetworkProxy *)in_stack_fffffffffffffbd0);
    if (PVar3 == NoProxy) {
      QHttpNetworkRequest::peerVerifyName
                ((QHttpNetworkRequest *)
                 CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      makeCacheKey((QUrl *)CONCAT44(uVar10,uVar9),in_RDI,in_stack_fffffffffffffc58);
      QByteArray::operator=
                ((QByteArray *)in_stack_fffffffffffffbd0,
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      QByteArray::~QByteArray((QByteArray *)0x30dce4);
      QString::~QString((QString *)0x30dcf1);
    }
    else {
      QHttpNetworkRequest::peerVerifyName
                ((QHttpNetworkRequest *)
                 CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      makeCacheKey((QUrl *)CONCAT44(uVar10,uVar9),in_RDI,in_stack_fffffffffffffc58);
      QByteArray::operator=
                ((QByteArray *)in_stack_fffffffffffffbd0,
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      QByteArray::~QByteArray((QByteArray *)0x30dc72);
      QString::~QString((QString *)0x30dc7f);
    }
  }
  else {
    QHttpNetworkRequest::peerVerifyName
              ((QHttpNetworkRequest *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8))
    ;
    makeCacheKey((QUrl *)CONCAT44(uVar10,uVar9),in_RDI,in_stack_fffffffffffffc58);
    QByteArray::operator=
              ((QByteArray *)in_stack_fffffffffffffbd0,
               (QByteArray *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    QByteArray::~QByteArray((QByteArray *)0x30dbda);
    QString::~QString((QString *)0x30dbe7);
  }
  QThreadStorage<QNetworkAccessCache_*>::localData
            ((QThreadStorage<QNetworkAccessCache_*> *)0x30dcff);
  this_00 = (QNetworkAccessAuthenticationManager *)
            QNetworkAccessCache::requestEntryNow
                      (in_stack_fffffffffffffbe8,(QByteArray *)in_stack_fffffffffffffbe0);
  if (this_00 == (QNetworkAccessAuthenticationManager *)0x0) {
    pQVar5 = (QNetworkProxyPrivate *)0x0;
  }
  else {
    pQVar5 = (QNetworkProxyPrivate *)&this_00[-1].authenticationCache.timer;
  }
  in_RDI[0x26].d.d.ptr = pQVar5;
  if (in_RDI[0x26].d.d.ptr == (QNetworkProxyPrivate *)0x0) {
    local_1d8[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_1d8[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_1d8[0].d.size = -0x5555555555555556;
    QFlags<QUrl::ComponentFormattingOption>::QFlags
              ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_fffffffffffffbd0,
               in_stack_fffffffffffffbcc);
    connectionCount = (quint16)((ulong)in_stack_fffffffffffffc08 >> 0x30);
    QUrl::host((QFlags_conflict *)local_1d8);
    in_stack_fffffffffffffbc8 = uVar10;
    if (bVar2 != 0) {
      local_1f8 = 0xaaaaaaaaaaaaaaaa;
      local_1f0 = 0xaaaaaaaaaaaaaaaa;
      local_1e8 = 0xaaaaaaaaaaaaaaaa;
      QHttpNetworkRequest::fullLocalServerName
                ((QHttpNetworkRequest *)
                 CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      bVar1 = QString::isEmpty((QString *)0x30de14);
      in_stack_fffffffffffffbc8 = uVar10;
      if (!bVar1) {
        QString::operator=(local_1d8,(QString *)&local_1f8);
        in_stack_fffffffffffffbc8 = uVar10;
      }
      QString::~QString((QString *)0x30de3a);
    }
    pQVar5 = (QNetworkProxyPrivate *)operator_new(0x40);
    QHttp1Configuration::numberOfConnectionsPerHost((QHttp1Configuration *)(in_RDI + 0x22));
    QUrl::port((int)&local_10);
    uVar10 = in_stack_fffffffffffffbc8;
    QNetworkAccessCachedHttpConnection::QNetworkAccessCachedHttpConnection
              (in_stack_fffffffffffffc10,connectionCount,in_stack_fffffffffffffc00,
               (quint16)((uint)uVar8 >> 0x10),SUB41((uint)uVar8 >> 8,0),SUB41(uVar8,0),
               (ConnectionType)pQVar5);
    in_RDI[0x26].d.d.ptr = pQVar5;
    if ((uVar10 == 1) || (uVar10 == 2)) {
      QHttpNetworkConnection::setHttp2Parameters
                ((QHttpNetworkConnection *)in_stack_fffffffffffffbd0,
                 (QHttp2Configuration *)
                 CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    }
    if (((ulong)in_RDI[2].d.d.ptr & 1) != 0) {
      QScopedPointer<QSslConfiguration,_QScopedPointerDeleter<QSslConfiguration>_>::operator*
                ((QScopedPointer<QSslConfiguration,_QScopedPointerDeleter<QSslConfiguration>_> *)
                 (in_RDI + 3));
      QHttpNetworkConnection::setSslConfiguration
                ((QHttpNetworkConnection *)in_stack_fffffffffffffbe0,
                 (QSslConfiguration *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8))
      ;
    }
    QHttpNetworkConnection::setTransparentProxy
              ((QHttpNetworkConnection *)in_stack_fffffffffffffbe0,
               (QNetworkProxy *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    QHttpNetworkConnection::setCacheProxy
              (in_stack_fffffffffffffbf0,(QNetworkProxy *)in_stack_fffffffffffffbe8);
    pQVar5 = in_RDI[0x26].d.d.ptr;
    QHttpNetworkRequest::peerVerifyName
              ((QHttpNetworkRequest *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8))
    ;
    QHttpNetworkConnection::setPeerVerifyName
              ((QHttpNetworkConnection *)in_stack_fffffffffffffbd0,
               (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    QString::~QString((QString *)0x30dfb0);
    ppQVar6 = QThreadStorage<QNetworkAccessCache_*>::localData
                        ((QThreadStorage<QNetworkAccessCache_*> *)0x30dfbc);
    QNetworkAccessCache::addEntry
              ((QNetworkAccessCache *)in_RDI[0x26].d.d.ptr,(QByteArray *)(in_RDI + 0x27),
               (CacheableObject *)*ppQVar6,(qint64)pQVar5);
    QString::~QString((QString *)0x30e035);
  }
  else {
    bVar1 = QHttpNetworkRequest::withCredentials((QHttpNetworkRequest *)0x30e04b);
    fromChannel = (int)((ulong)in_stack_fffffffffffffc10 >> 0x20);
    isProxy = (undefined1)((ulong)in_stack_fffffffffffffc00 >> 0x38);
    if (bVar1) {
      memset(local_258,0xaa,0x48);
      in_stack_fffffffffffffbe0 =
           (QHttpThreadDelegate *)
           std::
           __shared_ptr_access<QNetworkAccessAuthenticationManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QNetworkAccessAuthenticationManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x30e07c);
      QHttpNetworkRequest::url
                ((QHttpNetworkRequest *)
                 CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      QNetworkAccessAuthenticationManager::fetchCachedCredentials
                (this_00,(QUrl *)pQVar5,in_stack_fffffffffffffc20);
      QUrl::~QUrl(&local_260);
      bVar1 = QString::isEmpty((QString *)0x30e0d6);
      if ((!bVar1) && (bVar1 = QString::isEmpty((QString *)0x30e0ef), !bVar1)) {
        local_268.d = (QAuthenticatorPrivate *)0xaaaaaaaaaaaaaaaa;
        QAuthenticator::QAuthenticator(&local_268);
        QAuthenticator::setUser
                  ((QAuthenticator *)in_stack_fffffffffffffbd0,
                   (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        QAuthenticator::setPassword
                  ((QAuthenticator *)in_stack_fffffffffffffbd0,
                   (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x30e159);
        QHttpNetworkConnectionPrivate::copyCredentials
                  ((QHttpNetworkConnectionPrivate *)
                   CONCAT26(in_stack_fffffffffffffc1e,in_stack_fffffffffffffc18),fromChannel,
                   in_stack_fffffffffffffc08,(bool)isProxy);
        QAuthenticator::~QAuthenticator((QAuthenticator *)in_stack_fffffffffffffbd0);
      }
      QNetworkAuthenticationCredential::~QNetworkAuthenticationCredential(in_stack_fffffffffffffbd0)
      ;
    }
  }
  pQVar5 = (QNetworkProxyPrivate *)
           QHttpNetworkConnection::sendRequest
                     ((QHttpNetworkConnection *)in_stack_fffffffffffffbd0,
                      (QHttpNetworkRequest *)
                      CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  in_RDI[0x2a].d.d.ptr = pQVar5;
  QObject::setParent((QObject *)in_RDI[0x2a].d.d.ptr);
  if (((ulong)in_RDI[0x11].d.d.ptr & 1) == 0) {
    if (((ulong)in_RDI[0x11].d.d.ptr & 1) == 0) {
      QObject::connect((QObject *)&local_298,(char *)in_RDI[0x2a].d.d.ptr,
                       (QObject *)"2socketStartedConnecting()",(char *)in_RDI,0x3d6924);
      QMetaObject::Connection::~Connection(&local_298);
      QObject::connect((QObject *)&local_2a0,(char *)in_RDI[0x2a].d.d.ptr,
                       (QObject *)"2requestSent()",(char *)in_RDI,0x3d693f);
      QMetaObject::Connection::~Connection(&local_2a0);
      QObject::connect((QObject *)&local_2a8,(char *)in_RDI[0x2a].d.d.ptr,
                       (QObject *)"2headerChanged()",(char *)in_RDI,0x3d694e);
      QMetaObject::Connection::~Connection(&local_2a8);
      QObject::connect((QObject *)&local_2b0,(char *)in_RDI[0x2a].d.d.ptr,(QObject *)"2finished()",
                       (char *)in_RDI,0x3d6963);
      QMetaObject::Connection::~Connection(&local_2b0);
      QObject::connect((QObject *)&local_2b8,(char *)in_RDI[0x2a].d.d.ptr,
                       (QObject *)"2finishedWithError(QNetworkReply::NetworkError,QString)",
                       (char *)in_RDI,0x3d6973);
      QMetaObject::Connection::~Connection(&local_2b8);
      QObject::connect((QObject *)&local_2c0,(char *)in_RDI[0x2a].d.d.ptr,(QObject *)"2readyRead()",
                       (char *)in_RDI,0x3d69af);
      QMetaObject::Connection::~Connection(&local_2c0);
      QObject::connect((QObject *)&local_2c8,(char *)in_RDI[0x2a].d.d.ptr,
                       (QObject *)"2dataReadProgress(qint64,qint64)",(char *)in_RDI,0x3d69e1);
      QMetaObject::Connection::~Connection(&local_2c8);
      QObject::connect((QObject *)&local_2d0,(char *)in_RDI[0x2a].d.d.ptr,(QObject *)"2encrypted()",
                       (char *)in_RDI,0x3d6a13);
      QMetaObject::Connection::~Connection(&local_2d0);
      QObject::connect((QObject *)&local_2d8,(char *)in_RDI[0x2a].d.d.ptr,
                       (QObject *)"2sslErrors(QList<QSslError>)",(char *)in_RDI,0x3d6a24);
      QMetaObject::Connection::~Connection(&local_2d8);
      QObject::connect((QObject *)&local_2e0,(char *)in_RDI[0x2a].d.d.ptr,
                       (QObject *)
                       "2preSharedKeyAuthenticationRequired(QSslPreSharedKeyAuthenticator*)",
                       (char *)in_RDI,0x3d6a45);
      QMetaObject::Connection::~Connection(&local_2e0);
      QObject::connect((QObject *)&local_2e8,(char *)in_RDI[0x2a].d.d.ptr,
                       (QObject *)"2authenticationRequired(QHttpNetworkRequest,QAuthenticator*)",
                       (char *)in_RDI,0x3d6814);
      QMetaObject::Connection::~Connection(&local_2e8);
      QObject::connect((QObject *)&local_2f0,(char *)in_RDI[0x2a].d.d.ptr,
                       (QObject *)"2proxyAuthenticationRequired(QNetworkProxy,QAuthenticator*)",
                       (char *)in_RDI,0x3d689d);
      QMetaObject::Connection::~Connection(&local_2f0);
    }
  }
  else {
    QObject::connect((QObject *)&local_270,(char *)in_RDI[0x2a].d.d.ptr,
                     (QObject *)"2headerChanged()",(char *)in_RDI,0x3d675a);
    QMetaObject::Connection::~Connection(&local_270);
    QObject::connect((QObject *)&local_278,(char *)in_RDI[0x2a].d.d.ptr,(QObject *)"2finished()",
                     (char *)in_RDI,0x3d677a);
    QMetaObject::Connection::~Connection(&local_278);
    QObject::connect((QObject *)&local_280,(char *)in_RDI[0x2a].d.d.ptr,
                     (QObject *)"2finishedWithError(QNetworkReply::NetworkError,QString)",
                     (char *)in_RDI,0x3d67cd);
    QMetaObject::Connection::~Connection(&local_280);
    QObject::connect((QObject *)&local_288,(char *)in_RDI[0x2a].d.d.ptr,
                     (QObject *)"2authenticationRequired(QHttpNetworkRequest,QAuthenticator*)",
                     (char *)in_RDI,0x3d6851);
    QMetaObject::Connection::~Connection(&local_288);
    QObject::connect((QObject *)&local_290,(char *)in_RDI[0x2a].d.d.ptr,
                     (QObject *)"2proxyAuthenticationRequired(QNetworkProxy,QAuthenticator*)",
                     (char *)in_RDI,0x3d68d9);
    QMetaObject::Connection::~Connection(&local_290);
  }
  QObject::connect((QObject *)&local_2f8,(char *)in_RDI[0x2a].d.d.ptr,
                   (QObject *)"2cacheCredentials(QHttpNetworkRequest,QAuthenticator*)",
                   (char *)in_RDI,0x3d6ac4);
  QMetaObject::Connection::~Connection(&local_2f8);
  NVar4 = QHttpNetworkReply::errorCode((QHttpNetworkReply *)0x30e608);
  if (NVar4 != NoError) {
    if (((ulong)in_RDI[0x11].d.d.ptr & 1) == 0) {
      NVar4 = QHttpNetworkReply::errorCode((QHttpNetworkReply *)0x30e694);
      QHttpNetworkReply::errorString((QHttpNetworkReply *)CONCAT44(in_stack_fffffffffffffbdc,NVar4))
      ;
      finishedWithErrorSlot
                (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,
                 &in_stack_fffffffffffffbd0->domain);
      QString::~QString((QString *)0x30e6dc);
    }
    else {
      NVar4 = QHttpNetworkReply::errorCode((QHttpNetworkReply *)0x30e636);
      QHttpNetworkReply::errorString((QHttpNetworkReply *)CONCAT44(NVar4,in_stack_fffffffffffffbd8))
      ;
      synchronousFinishedWithErrorSlot
                (in_stack_fffffffffffffbe0,NVar4,&in_stack_fffffffffffffbd0->domain);
      QString::~QString((QString *)0x30e67e);
    }
  }
  QString::~QString((QString *)0x30e6eb);
  QUrl::~QUrl(&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::startRequest()
{
#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::startRequest() thread=" << QThread::currentThreadId();
#endif
    // Check QThreadStorage for the QNetworkAccessCache
    // If not there, create this connection cache
    if (!connections.hasLocalData()) {
        connections.setLocalData(new QNetworkAccessCache());
    }

    // check if we have an open connection to this host
    QUrl urlCopy = httpRequest.url();
    const bool isLocalSocket = urlCopy.scheme().startsWith("unix"_L1);
    if (!isLocalSocket)
        urlCopy.setPort(urlCopy.port(ssl ? 443 : 80));

    QHttpNetworkConnection::ConnectionType connectionType
        = httpRequest.isHTTP2Allowed() ? QHttpNetworkConnection::ConnectionTypeHTTP2
                                       : QHttpNetworkConnection::ConnectionTypeHTTP;
    if (httpRequest.isHTTP2Direct()) {
        Q_ASSERT(!httpRequest.isHTTP2Allowed());
        connectionType = QHttpNetworkConnection::ConnectionTypeHTTP2Direct;
    }

    // Use HTTP/1.1 if h2c is not allowed and we would otherwise choose to use it
    if (!ssl && connectionType == QHttpNetworkConnection::ConnectionTypeHTTP2
        && !httpRequest.isH2cAllowed()) {
        connectionType = QHttpNetworkConnection::ConnectionTypeHTTP;
    }

#if QT_CONFIG(ssl)
    // See qnetworkreplyhttpimpl, delegate's initialization code.
    Q_ASSERT(!ssl || incomingSslConfiguration.data());
#endif // QT_CONFIG(ssl)

    const bool isH2 = httpRequest.isHTTP2Allowed() || httpRequest.isHTTP2Direct();
    if (isH2) {
#if QT_CONFIG(ssl)
        if (ssl) {
            if (!httpRequest.isHTTP2Direct()) {
                QList<QByteArray> protocols;
                protocols << QSslConfiguration::ALPNProtocolHTTP2
                          << QSslConfiguration::NextProtocolHttp1_1;
                incomingSslConfiguration->setAllowedNextProtocols(protocols);
            }
            urlCopy.setScheme(QStringLiteral("h2s"));
        } else
#endif // QT_CONFIG(ssl)
        {
            if (isLocalSocket)
                urlCopy.setScheme(QStringLiteral("unix+h2"));
            else
                urlCopy.setScheme(QStringLiteral("h2"));
        }
    }

    QString extraData = httpRequest.peerVerifyName();
    if (isLocalSocket) {
        if (QString path = httpRequest.fullLocalServerName(); !path.isEmpty())
            extraData = path;
    }

#ifndef QT_NO_NETWORKPROXY
    if (transparentProxy.type() != QNetworkProxy::NoProxy)
        cacheKey = makeCacheKey(urlCopy, &transparentProxy, httpRequest.peerVerifyName());
    else if (cacheProxy.type() != QNetworkProxy::NoProxy)
        cacheKey = makeCacheKey(urlCopy, &cacheProxy, httpRequest.peerVerifyName());
    else
#endif
        cacheKey = makeCacheKey(urlCopy, nullptr, httpRequest.peerVerifyName());

    // the http object is actually a QHttpNetworkConnection
    httpConnection = static_cast<QNetworkAccessCachedHttpConnection *>(connections.localData()->requestEntryNow(cacheKey));
    if (!httpConnection) {

        QString host = urlCopy.host();
        // Update the host if a unix socket path or named pipe is used:
        if (isLocalSocket) {
            if (QString path = httpRequest.fullLocalServerName(); !path.isEmpty())
                host = path;
        }

        // no entry in cache; create an object
        // the http object is actually a QHttpNetworkConnection
        httpConnection = new QNetworkAccessCachedHttpConnection(
                http1Parameters.numberOfConnectionsPerHost(), host, urlCopy.port(), ssl,
                isLocalSocket, connectionType);
        if (connectionType == QHttpNetworkConnection::ConnectionTypeHTTP2
            || connectionType == QHttpNetworkConnection::ConnectionTypeHTTP2Direct) {
            httpConnection->setHttp2Parameters(http2Parameters);
        }
#ifndef QT_NO_SSL
        // Set the QSslConfiguration from this QNetworkRequest.
        if (ssl)
            httpConnection->setSslConfiguration(*incomingSslConfiguration);
#endif

#ifndef QT_NO_NETWORKPROXY
        httpConnection->setTransparentProxy(transparentProxy);
        httpConnection->setCacheProxy(cacheProxy);
#endif
        httpConnection->setPeerVerifyName(httpRequest.peerVerifyName());
        // cache the QHttpNetworkConnection corresponding to this cache key
        connections.localData()->addEntry(cacheKey, httpConnection, connectionCacheExpiryTimeoutSeconds);
    } else {
        if (httpRequest.withCredentials()) {
            QNetworkAuthenticationCredential credential = authenticationManager->fetchCachedCredentials(httpRequest.url(), nullptr);
            if (!credential.user.isEmpty() && !credential.password.isEmpty()) {
                QAuthenticator auth;
                auth.setUser(credential.user);
                auth.setPassword(credential.password);
                httpConnection->d_func()->copyCredentials(-1, &auth, false);
            }
        }
    }

    // Send the request to the connection
    httpReply = httpConnection->sendRequest(httpRequest);
    httpReply->setParent(this);

    // Connect the reply signals that we need to handle and then forward
    if (synchronous) {
        connect(httpReply,SIGNAL(headerChanged()), this, SLOT(synchronousHeaderChangedSlot()));
        connect(httpReply,SIGNAL(finished()), this, SLOT(synchronousFinishedSlot()));
        connect(httpReply,SIGNAL(finishedWithError(QNetworkReply::NetworkError,QString)),
                this, SLOT(synchronousFinishedWithErrorSlot(QNetworkReply::NetworkError,QString)));

        connect(httpReply, SIGNAL(authenticationRequired(QHttpNetworkRequest,QAuthenticator*)),
                this, SLOT(synchronousAuthenticationRequiredSlot(QHttpNetworkRequest,QAuthenticator*)));
#ifndef QT_NO_NETWORKPROXY
        connect(httpReply, SIGNAL(proxyAuthenticationRequired(QNetworkProxy,QAuthenticator*)),
                this, SLOT(synchronousProxyAuthenticationRequiredSlot(QNetworkProxy,QAuthenticator*)));
#endif

        // Don't care about ignored SSL errors for now in the synchronous HTTP case.
    } else if (!synchronous) {
        connect(httpReply,SIGNAL(socketStartedConnecting()), this, SIGNAL(socketStartedConnecting()));
        connect(httpReply,SIGNAL(requestSent()), this, SIGNAL(requestSent()));
        connect(httpReply,SIGNAL(headerChanged()), this, SLOT(headerChangedSlot()));
        connect(httpReply,SIGNAL(finished()), this, SLOT(finishedSlot()));
        connect(httpReply,SIGNAL(finishedWithError(QNetworkReply::NetworkError,QString)),
                this, SLOT(finishedWithErrorSlot(QNetworkReply::NetworkError,QString)));
        // some signals are only interesting when normal asynchronous style is used
        connect(httpReply,SIGNAL(readyRead()), this, SLOT(readyReadSlot()));
        connect(httpReply,SIGNAL(dataReadProgress(qint64,qint64)), this, SLOT(dataReadProgressSlot(qint64,qint64)));
#ifndef QT_NO_SSL
        connect(httpReply,SIGNAL(encrypted()), this, SLOT(encryptedSlot()));
        connect(httpReply,SIGNAL(sslErrors(QList<QSslError>)), this, SLOT(sslErrorsSlot(QList<QSslError>)));
        connect(httpReply,SIGNAL(preSharedKeyAuthenticationRequired(QSslPreSharedKeyAuthenticator*)),
                this, SLOT(preSharedKeyAuthenticationRequiredSlot(QSslPreSharedKeyAuthenticator*)));
#endif

        // In the asynchronous HTTP case we can just forward those signals
        // Connect the reply signals that we can directly forward
        connect(httpReply, SIGNAL(authenticationRequired(QHttpNetworkRequest,QAuthenticator*)),
                this, SIGNAL(authenticationRequired(QHttpNetworkRequest,QAuthenticator*)));
#ifndef QT_NO_NETWORKPROXY
        connect(httpReply, SIGNAL(proxyAuthenticationRequired(QNetworkProxy,QAuthenticator*)),
                this, SIGNAL(proxyAuthenticationRequired(QNetworkProxy,QAuthenticator*)));
#endif
    }

    connect(httpReply, SIGNAL(cacheCredentials(QHttpNetworkRequest,QAuthenticator*)),
            this, SLOT(cacheCredentialsSlot(QHttpNetworkRequest,QAuthenticator*)));
    if (httpReply->errorCode() != QNetworkReply::NoError) {
        if (synchronous)
            synchronousFinishedWithErrorSlot(httpReply->errorCode(), httpReply->errorString());
        else
            finishedWithErrorSlot(httpReply->errorCode(), httpReply->errorString());
    }
}